

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O0

void ftghbn_(int *A1,int *A2,int *A3,int *A4,char *A5,char *A6,char *A7,char *A8,int *A9,int *A10,
            size_t C5,size_t C6,size_t C7,size_t C8)

{
  long lVar1;
  uint nelem;
  char *tfields_00;
  int iVar2;
  char *pcVar3;
  char **ppcVar4;
  char **ppcVar5;
  char **ppcVar6;
  size_t sVar7;
  size_t sVar8;
  uint elem_len;
  uint uVar9;
  uint uVar10;
  size_t local_168;
  unsigned_long local_150;
  uint local_130;
  uint local_124;
  uint local_108;
  uint local_fc;
  uint local_e0;
  uint local_d4;
  int local_b8;
  int local_b0;
  int *status;
  long lStack_98;
  int maxdim;
  long tfields;
  fitsfile *fptr;
  long B9;
  char *B8;
  uint B7M;
  uint B7N;
  char **B7;
  uint B6M;
  uint B6N;
  char **B6;
  uint B5M;
  uint B5N;
  char **B5;
  long B3;
  char *A6_local;
  char *A5_local;
  int *A4_local;
  int *A3_local;
  int *A2_local;
  int *A1_local;
  
  B9 = 0;
  tfields = (long)gFitsFiles[*A1];
  local_b8 = *A2;
  B3 = (long)A6;
  A6_local = A5;
  A5_local = (char *)A4;
  A4_local = A3;
  A3_local = A2;
  A2_local = A1;
  ffgkyj((fitsfile *)tfields,"TFIELDS",&stack0xffffffffffffff68,(char *)0x0,A10);
  tfields_00 = A5_local;
  lVar1 = tfields;
  local_b0 = (int)lStack_98;
  if (-1 < local_b8) {
    if (lStack_98 < local_b8) {
      local_b8 = local_b0;
    }
    local_b0 = local_b8;
  }
  B5 = (char **)(long)*A4_local;
  elem_len = (uint)C5;
  iVar2 = num_elem(A6_local,elem_len,local_b0,-1);
  if (iVar2 < 2) {
    local_d4 = 1;
  }
  else {
    local_d4 = num_elem(A6_local,elem_len,local_b0,-1);
  }
  B6._4_4_ = local_d4;
  local_e0 = elem_len;
  if (C5 <= gMinStrLen) {
    local_e0 = (uint)gMinStrLen;
  }
  B6._0_4_ = local_e0 + 1;
  _B5M = (char **)malloc((ulong)local_d4 << 3);
  pcVar3 = (char *)malloc((ulong)(B6._4_4_ * (int)B6));
  ppcVar4 = _B5M;
  uVar9 = B6._4_4_;
  iVar2 = (int)B6;
  *_B5M = pcVar3;
  pcVar3 = f2cstrv2(A6_local,*_B5M,elem_len,(int)B6,B6._4_4_);
  ppcVar4 = vindex(ppcVar4,iVar2,uVar9,pcVar3);
  uVar9 = (uint)C6;
  iVar2 = num_elem((char *)B3,uVar9,local_b0,-1);
  if (iVar2 < 2) {
    local_fc = 1;
  }
  else {
    local_fc = num_elem((char *)B3,uVar9,local_b0,-1);
  }
  B7._4_4_ = local_fc;
  local_108 = uVar9;
  if (C6 <= gMinStrLen) {
    local_108 = (uint)gMinStrLen;
  }
  B7._0_4_ = local_108 + 1;
  _B6M = (char **)malloc((ulong)local_fc << 3);
  pcVar3 = (char *)malloc((ulong)(B7._4_4_ * (int)B7));
  ppcVar5 = _B6M;
  uVar10 = B7._4_4_;
  iVar2 = (int)B7;
  *_B6M = pcVar3;
  pcVar3 = f2cstrv2((char *)B3,*_B6M,uVar9,(int)B7,B7._4_4_);
  ppcVar5 = vindex(ppcVar5,iVar2,uVar10,pcVar3);
  uVar10 = (uint)C7;
  iVar2 = num_elem(A7,uVar10,local_b0,-1);
  if (iVar2 < 2) {
    local_124 = 1;
  }
  else {
    local_124 = num_elem(A7,uVar10,local_b0,-1);
  }
  B8._4_4_ = local_124;
  local_130 = uVar10;
  if (C7 <= gMinStrLen) {
    local_130 = (uint)gMinStrLen;
  }
  B8._0_4_ = local_130 + 1;
  _B7M = (char **)malloc((ulong)local_124 << 3);
  pcVar3 = (char *)malloc((ulong)(B8._4_4_ * (int)B8));
  ppcVar6 = _B7M;
  nelem = B8._4_4_;
  iVar2 = (int)B8;
  *_B7M = pcVar3;
  pcVar3 = f2cstrv2(A7,*_B7M,uVar10,(int)B8,B8._4_4_);
  ppcVar6 = vindex(ppcVar6,iVar2,nelem,pcVar3);
  if (gMinStrLen < C8) {
    local_150 = C8;
  }
  else {
    local_150 = gMinStrLen;
  }
  B9 = (long)malloc(local_150 + 1);
  *(undefined1 *)(B9 + C8) = 0;
  memcpy((void *)B9,A8,C8);
  pcVar3 = kill_trailing((char *)B9,' ');
  fptr = (fitsfile *)(long)*A9;
  ffghbn((fitsfile *)lVar1,local_b0,(long *)&B5,(int *)tfields_00,ppcVar4,ppcVar5,ppcVar6,pcVar3,
         (long *)&fptr,A10);
  *A4_local = (int)B5;
  c2fstrv2(*_B5M,A6_local,(int)B6,elem_len,B6._4_4_);
  free(*_B5M);
  free(_B5M);
  c2fstrv2(*_B6M,(char *)B3,(int)B7,uVar9,B7._4_4_);
  free(*_B6M);
  free(_B6M);
  c2fstrv2(*_B7M,A7,(int)B8,uVar10,B8._4_4_);
  free(*_B7M);
  free(_B7M);
  lVar1 = B9;
  if (B9 != 0) {
    sVar7 = strlen((char *)B9);
    if (sVar7 < C8) {
      local_168 = strlen((char *)B9);
    }
    else {
      local_168 = C8;
    }
    memcpy(A8,(void *)lVar1,local_168);
    sVar7 = strlen((char *)B9);
    if (sVar7 < C8) {
      sVar7 = strlen((char *)B9);
      sVar8 = strlen((char *)B9);
      memset(A8 + sVar7,0x20,C8 - sVar8);
    }
    free((void *)B9);
  }
  *A9 = (int)fptr;
  return;
}

Assistant:

CFextern VOID_cfF(FTGHBN,ftghbn)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),FITSUNIT,INT,PLONG,PINT,PSTRINGV,PSTRINGV,PSTRINGV,PSTRING,PLONG,PINT,CF_0,CF_0,CF_0,CF_0))
{
   QCF(FITSUNIT,1)
   QCF(INT,2)
   QCF(PLONG,3)
   QCF(PINT,4)
   QCF(PSTRINGV,5)
   QCF(PSTRINGV,6)
   QCF(PSTRINGV,7)
   QCF(PSTRING,8)
   QCF(PLONG,9)
   QCF(PINT,10)

   fitsfile *fptr;
   long tfields;
   int maxdim,*status;

   fptr = TCF(ftghbn,FITSUNIT,1,0);
   status =  TCF(ftghbn,PINT,10,0);
   maxdim =  TCF(ftghbn,INT,2,0);
   ffgkyj( fptr, "TFIELDS", &tfields, 0, status );
   maxdim = (maxdim<0) ? tfields : _cfMIN(tfields,maxdim);

   ffghbn(   fptr, maxdim
             TCF(ftghbn,PLONG,3,1)
             TCF(ftghbn,PINT,4,1)
             TCF(ftghbn,PSTRINGV,5,1)
             TCF(ftghbn,PSTRINGV,6,1)
             TCF(ftghbn,PSTRINGV,7,1)
             TCF(ftghbn,PSTRING,8,1)
             TCF(ftghbn,PLONG,9,1)
             , status );

   RCF(FITSUNIT,1)
   RCF(INT,2)
   RCF(PLONG,3)
   RCF(PINT,4)
   RCF(PSTRINGV,5)
   RCF(PSTRINGV,6)
   RCF(PSTRINGV,7)
   RCF(PSTRING,8)
   RCF(PLONG,9)
   RCF(PINT,10)
}